

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O3

void __thiscall cmCPackArchiveGenerator::~cmCPackArchiveGenerator(cmCPackArchiveGenerator *this)

{
  ~cmCPackArchiveGenerator(this);
  operator_delete(this,0x1b0);
  return;
}

Assistant:

cmCPackArchiveGenerator::~cmCPackArchiveGenerator() = default;